

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
PossibleContentsTest_TestHash_Test::TestBody(PossibleContentsTest_TestHash_Test *this)

{
  bool bVar1;
  char *pcVar2;
  PossibleContents *pPVar3;
  AssertHelper local_380;
  Message local_378;
  size_t local_370;
  size_t local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_17;
  Message local_348;
  size_t local_340;
  size_t local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_16;
  Message local_318;
  size_t local_310;
  size_t local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_15;
  Message local_2e8;
  size_t local_2e0;
  size_t local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_14;
  Message local_2b8;
  size_t local_2b0;
  size_t local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_13;
  Message local_288;
  size_t local_280;
  size_t local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_12;
  Message local_258;
  size_t local_250;
  size_t local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_11;
  Message local_228;
  size_t local_220;
  size_t local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_10;
  Message local_1f8;
  size_t local_1f0;
  size_t local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_9;
  Message local_1c8;
  size_t local_1c0;
  size_t local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_8;
  Message local_198;
  size_t local_190;
  size_t local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_7;
  Message local_168;
  size_t local_160;
  size_t local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_6;
  Message local_138;
  size_t local_130;
  size_t local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_5;
  Message local_108;
  size_t local_100;
  size_t local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_4;
  Message local_d8;
  size_t local_d0;
  size_t local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_3;
  Message local_a8;
  size_t local_a0;
  size_t local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  size_t local_70;
  size_t local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48 [3];
  size_t local_30;
  size_t local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  PossibleContentsTest_TestHash_Test *this_local;
  
  pPVar3 = &(this->super_PossibleContentsTest).none;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_28 = ::wasm::PossibleContents::hash(pPVar3);
  local_30 = ::wasm::PossibleContents::hash(pPVar3);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_20,"none.hash()","none.hash()",&local_28,&local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0x9c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  pPVar3 = &(this->super_PossibleContentsTest).many;
  local_68 = ::wasm::PossibleContents::hash(pPVar3);
  local_70 = ::wasm::PossibleContents::hash(pPVar3);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_60,"many.hash()","many.hash()",&local_68,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_98 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).none);
  local_a0 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).many);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_90,"none.hash()","many.hash()",&local_98,&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_c8 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).none);
  local_d0 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).i32Zero);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_c0,"none.hash()","i32Zero.hash()",&local_c8,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_f8 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).none);
  local_100 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).i32One);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_f0,"none.hash()","i32One.hash()",&local_f8,&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_128 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).none);
  local_130 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).anyGlobal);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_120,"none.hash()","anyGlobal.hash()",&local_128,&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_158 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).none);
  local_160 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).funcGlobal);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_150,"none.hash()","funcGlobal.hash()",&local_158,&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xa6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_188 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).none);
  local_190 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).exactAnyref);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_180,"none.hash()","exactAnyref.hash()",&local_188,&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xa7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1b8 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).none);
  local_1c0 = ::wasm::PossibleContents::hash
                        (&(this->super_PossibleContentsTest).exactFuncSignatureType);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_1b0,"none.hash()","exactFuncSignatureType.hash()",&local_1b8,
             &local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xa8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_1e8 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).none);
  local_1f0 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).coneAnyref);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_1e0,"none.hash()","coneAnyref.hash()",&local_1e8,&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_218 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).none);
  local_220 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).coneFuncref);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_210,"none.hash()","coneFuncref.hash()",&local_218,&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_248 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).none);
  local_250 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).coneFuncref1);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_240,"none.hash()","coneFuncref1.hash()",&local_248,&local_250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xab,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  local_278 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).i32Zero);
  local_280 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).i32One);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_270,"i32Zero.hash()","i32One.hash()",&local_278,&local_280);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_2a8 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).anyGlobal);
  local_2b0 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).funcGlobal);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_2a0,"anyGlobal.hash()","funcGlobal.hash()",&local_2a8,&local_2b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  local_2d8 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).exactAnyref);
  local_2e0 = ::wasm::PossibleContents::hash
                        (&(this->super_PossibleContentsTest).exactFuncSignatureType);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_2d0,"exactAnyref.hash()","exactFuncSignatureType.hash()",&local_2d8,
             &local_2e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_308 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).coneAnyref);
  local_310 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).coneFuncref);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_300,"coneAnyref.hash()","coneFuncref.hash()",&local_308,&local_310);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  local_338 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).coneAnyref);
  local_340 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).coneFuncref1);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_330,"coneAnyref.hash()","coneFuncref1.hash()",&local_338,&local_340);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xb1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  local_368 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).coneFuncref);
  local_370 = ::wasm::PossibleContents::hash(&(this->super_PossibleContentsTest).coneFuncref1);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_360,"coneFuncref.hash()","coneFuncref1.hash()",&local_368,&local_370)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/possible-contents.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  return;
}

Assistant:

TEST_F(PossibleContentsTest, TestHash) {
  // Hashes should be deterministic.
  EXPECT_EQ(none.hash(), none.hash());
  EXPECT_EQ(many.hash(), many.hash());

  // Hashes should be different. (In theory hash collisions could appear here,
  // but if such simple things collide and the test fails then we should really
  // rethink our hash functions!)
  EXPECT_NE(none.hash(), many.hash());
  EXPECT_NE(none.hash(), i32Zero.hash());
  EXPECT_NE(none.hash(), i32One.hash());
  EXPECT_NE(none.hash(), anyGlobal.hash());
  EXPECT_NE(none.hash(), funcGlobal.hash());
  EXPECT_NE(none.hash(), exactAnyref.hash());
  EXPECT_NE(none.hash(), exactFuncSignatureType.hash());
  EXPECT_NE(none.hash(), coneAnyref.hash());
  EXPECT_NE(none.hash(), coneFuncref.hash());
  EXPECT_NE(none.hash(), coneFuncref1.hash());

  EXPECT_NE(i32Zero.hash(), i32One.hash());
  EXPECT_NE(anyGlobal.hash(), funcGlobal.hash());
  EXPECT_NE(exactAnyref.hash(), exactFuncSignatureType.hash());
  EXPECT_NE(coneAnyref.hash(), coneFuncref.hash());
  EXPECT_NE(coneAnyref.hash(), coneFuncref1.hash());
  EXPECT_NE(coneFuncref.hash(), coneFuncref1.hash());
}